

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_ctype_graph(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  ushort **ppuVar1;
  int local_3c;
  uchar *puStack_38;
  int nLen;
  uchar *zEnd;
  uchar *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (uchar *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zEnd = (uchar *)jx9_value_to_string(*apArg,&local_3c);
    puStack_38 = zEnd + local_3c;
    if (local_3c < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      for (; zEnd < puStack_38; zEnd = zEnd + 1) {
        if ((0xbf < *zEnd) ||
           (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*zEnd] & 0x8000) == 0)) {
          jx9_result_bool(pjStack_18,0);
          return 0;
        }
      }
      jx9_result_bool(pjStack_18,1);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_ctype_graph(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn  = (const unsigned char *)jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* If we reach the end of the string, then the test succeeded. */
			jx9_result_bool(pCtx, 1);
			return JX9_OK;
		}
		if( zIn[0] >= 0xc0 ){
			/* UTF-8 stream  */
			break;
		}
		if( !SyisGraph(zIn[0]) ){
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	/* The test failed, return FALSE */
	jx9_result_bool(pCtx, 0);
	return JX9_OK;
}